

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O2

void __thiscall helics::FederateInfo::loadInfoFromArgsIgnoreOutput(FederateInfo *this,string *args)

{
  ParseOutput PVar1;
  InvalidParameter *this_00;
  string_view message;
  helicsCLI11App *local_20;
  
  makeCLIApp((FederateInfo *)&stack0xffffffffffffffe0);
  PVar1 = helicsCLI11App::helics_parse<std::__cxx11::string_const&>(local_20,args);
  if (PVar1 != PARSE_ERROR) {
    config_additional(this,&local_20->super_App);
    if (local_20 != (helicsCLI11App *)0x0) {
      (*(local_20->super_App)._vptr_App[1])();
    }
    return;
  }
  this_00 = (InvalidParameter *)__cxa_allocate_exception(0x28);
  message._M_str = "argument parsing failed";
  message._M_len = 0x17;
  InvalidParameter::InvalidParameter(this_00,message);
  __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void FederateInfo::loadInfoFromArgsIgnoreOutput(const std::string& args)
{
    auto app = makeCLIApp();
    auto ret = app->helics_parse(args);
    if (ret == helicsCLI11App::ParseOutput::PARSE_ERROR) {
        throw helics::InvalidParameter("argument parsing failed");
    }
    config_additional(app.get());
}